

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::Initialize(Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
             *this,pair<unsigned_long,_duckdb::hugeint_t> *value)

{
  pointer pNVar1;
  int64_t iVar2;
  result_type rVar3;
  
  (this->_value).first = value->first;
  iVar2 = (value->second).upper;
  (this->_value).second.lower = (value->second).lower;
  (this->_value).second.upper = iVar2;
  (this->_nodeRefs)._swapLevel = 0;
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nodeRefs)._nodes.
      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->_nodeRefs)._nodes.
    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  do {
    SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
    ::push_back(&this->_nodeRefs,this,
                (ulong)((this->_nodeRefs)._nodes.
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                       (this->_nodeRefs)._nodes.
                       super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
    rVar3 = pcg_detail::
            engine<unsigned_int,_unsigned_long,_pcg_detail::xsh_rs_mixin<unsigned_int,_unsigned_long>,_true,_pcg_detail::no_stream<unsigned_long>,_pcg_detail::default_multiplier<unsigned_long>_>
            ::operator()(&this->_pool->prng);
  } while (rVar3 < 0x7fffffff);
  return;
}

Assistant:

void Initialize(const T &value) {
		_value = value;
		_nodeRefs.clear();
		do {
			_nodeRefs.push_back(this, _nodeRefs.height() ? 0 : 1);
		} while (_pool.prng() < _pool.prng.max() / 2);
	}